

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alhelpers.c
# Opt level: O0

int InitAL(char ***argv,int *argc)

{
  char cVar1;
  int iVar2;
  long lVar3;
  int *in_RSI;
  long *in_RDI;
  ALCcontext *ctx;
  ALCdevice *device;
  ALCchar *name;
  long local_28;
  long local_20;
  
  local_28 = 0;
  if ((((in_RSI != (int *)0x0) && (in_RDI != (long *)0x0)) && (1 < *in_RSI)) &&
     (iVar2 = strcmp(*(char **)*in_RDI,"-device"), iVar2 == 0)) {
    local_28 = alcOpenDevice(*(undefined8 *)(*in_RDI + 8));
    if (local_28 == 0) {
      fprintf(_stderr,"Failed to open \"%s\", trying default\n",*(undefined8 *)(*in_RDI + 8));
    }
    *in_RDI = *in_RDI + 0x10;
    *in_RSI = *in_RSI + -2;
  }
  if (local_28 == 0) {
    local_28 = alcOpenDevice(0);
  }
  if (local_28 != 0) {
    lVar3 = alcCreateContext(local_28,0);
    if ((lVar3 != 0) && (cVar1 = alcMakeContextCurrent(lVar3), cVar1 != '\0')) {
      local_20 = 0;
      cVar1 = alcIsExtensionPresent(local_28,"ALC_ENUMERATE_ALL_EXT");
      if (cVar1 != '\0') {
        local_20 = alcGetString(local_28,0x1013);
      }
      if ((local_20 == 0) || (iVar2 = alcGetError(local_28), iVar2 != 0)) {
        local_20 = alcGetString(local_28,0x1005);
      }
      printf("Opened \"%s\"\n",local_20);
      return 0;
    }
    if (lVar3 != 0) {
      alcDestroyContext(lVar3);
    }
    alcCloseDevice(local_28);
    fprintf(_stderr,"Could not set a context!\n");
    return 1;
  }
  fprintf(_stderr,"Could not open a device!\n");
  return 1;
}

Assistant:

int InitAL(char ***argv, int *argc)
{
    const ALCchar *name;
    ALCdevice *device;
    ALCcontext *ctx;

    /* Open and initialize a device */
    device = NULL;
    if(argc && argv && *argc > 1 && strcmp((*argv)[0], "-device") == 0)
    {
        device = alcOpenDevice((*argv)[1]);
        if(!device)
            fprintf(stderr, "Failed to open \"%s\", trying default\n", (*argv)[1]);
        (*argv) += 2;
        (*argc) -= 2;
    }
    if(!device)
        device = alcOpenDevice(NULL);
    if(!device)
    {
        fprintf(stderr, "Could not open a device!\n");
        return 1;
    }

    ctx = alcCreateContext(device, NULL);
    if(ctx == NULL || alcMakeContextCurrent(ctx) == ALC_FALSE)
    {
        if(ctx != NULL)
            alcDestroyContext(ctx);
        alcCloseDevice(device);
        fprintf(stderr, "Could not set a context!\n");
        return 1;
    }

    name = NULL;
    if(alcIsExtensionPresent(device, "ALC_ENUMERATE_ALL_EXT"))
        name = alcGetString(device, ALC_ALL_DEVICES_SPECIFIER);
    if(!name || alcGetError(device) != AL_NO_ERROR)
        name = alcGetString(device, ALC_DEVICE_SPECIFIER);
    printf("Opened \"%s\"\n", name);

    return 0;
}